

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelFillsElement::~IfcRelFillsElement
          (IfcRelFillsElement *this,void **vtt)

{
  void **vtt_local;
  IfcRelFillsElement *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelFillsElement,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelFillsElement,_2UL> *)
             &(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8,vtt + 0x10);
  IfcRelConnects::~IfcRelConnects(&this->super_IfcRelConnects,vtt + 1);
  return;
}

Assistant:

IfcRelFillsElement() : Object("IfcRelFillsElement") {}